

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * ImageFromChannel(Image *__return_storage_ptr__,Image image,int selectedChannel)

{
  ushort uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  char *text;
  int iVar5;
  float fVar6;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  if (image.height == 0 || (image.width == 0 || image.data == (void *)0x0)) {
    return __return_storage_ptr__;
  }
  if (selectedChannel < 0) {
    selectedChannel = 0;
    TraceLog(4,"Channel cannot be negative. Setting channel to 0.");
  }
  if (image.format < 8) {
    if (image.format == 1) {
LAB_0019714f:
      if (selectedChannel == 0) {
        selectedChannel = 0;
        goto LAB_001971a2;
      }
      text = "This image has only 1 channel. Setting channel to it.";
      selectedChannel = 0;
    }
    else {
      if (image.format != 2) goto LAB_00197165;
      if ((uint)selectedChannel < 2) goto LAB_001971a2;
      text = "This image has only 2 channels. Setting channel to alpha.";
      selectedChannel = 1;
    }
  }
  else {
    if ((image.format == 0xb) || (image.format == 8)) goto LAB_0019714f;
LAB_00197165:
    if (((uint)selectedChannel < 3) ||
       ((image.format != 9 && image.format != 0xc) && 1 < image.format - 3U)) goto LAB_001971a2;
    text = "This image has only 3 channels. Setting channel to red.";
    selectedChannel = 0;
  }
  TraceLog(4,text);
LAB_001971a2:
  if (3 < selectedChannel) {
    TraceLog(4,"ImageFromChannel supports channels 0 to 3 (rgba). Setting channel to alpha.");
    selectedChannel = 3;
  }
  __return_storage_ptr__->height = image.height;
  __return_storage_ptr__->width = image.width;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 1;
  uVar3 = image.height * image.width;
  pvVar2 = calloc((long)(int)uVar3,1);
  if (image.format < 0xe) {
    if (0 < (int)uVar3) {
      uVar4 = 0;
      iVar5 = 0;
      do {
        switch(image.format) {
        case 1:
          fVar6 = (float)*(byte *)((long)image.data + uVar4 + (long)selectedChannel) / 255.0;
          break;
        case 2:
          fVar6 = (float)*(byte *)((long)image.data + (long)(iVar5 + selectedChannel)) / 255.0;
          iVar5 = iVar5 + 2;
          break;
        case 3:
          uVar1 = *(ushort *)((long)image.data + uVar4 * 2);
          if (selectedChannel == 2) goto LAB_001973ff;
          if (selectedChannel == 1) {
            fVar6 = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
            break;
          }
          if (selectedChannel != 0) goto switchD_00197251_default;
LAB_0019731c:
          uVar1 = uVar1 >> 0xb;
          goto LAB_00197402;
        case 4:
          fVar6 = (float)*(byte *)((long)image.data + (long)(iVar5 + selectedChannel)) / 255.0;
          goto LAB_001973f2;
        case 5:
          uVar1 = *(ushort *)((long)image.data + uVar4 * 2);
          if (selectedChannel == 2) {
            uVar1 = uVar1 >> 1;
          }
          else {
            if (selectedChannel != 1) {
              if (selectedChannel == 0) goto LAB_0019731c;
              fVar6 = 0.0;
              if ((uVar1 & 1) != 0) {
                fVar6 = 1.0;
              }
              break;
            }
            uVar1 = uVar1 >> 6;
          }
LAB_001973ff:
          uVar1 = uVar1 & 0x1f;
LAB_00197402:
          fVar6 = (float)uVar1 * 0.032258064;
          break;
        case 6:
          uVar1 = *(ushort *)((long)image.data + uVar4 * 2);
          if (selectedChannel == 2) {
            uVar1 = uVar1 >> 4;
LAB_00197432:
            uVar1 = uVar1 & 0xf;
          }
          else {
            if (selectedChannel == 1) {
              uVar1 = uVar1 >> 8;
              goto LAB_00197432;
            }
            if (selectedChannel != 0) goto LAB_00197432;
            uVar1 = uVar1 >> 0xc;
          }
          fVar6 = (float)uVar1 * 0.06666667;
          break;
        case 7:
          fVar6 = (float)*(byte *)((long)image.data + (long)(iVar5 + selectedChannel)) / 255.0;
          goto LAB_001973ba;
        case 8:
          fVar6 = *(float *)((long)image.data + (long)iVar5 * 4);
          goto LAB_001973e2;
        case 9:
          fVar6 = *(float *)((long)image.data + (long)(iVar5 + selectedChannel) * 4);
          goto LAB_001973f2;
        case 10:
          fVar6 = *(float *)((long)image.data + (long)(iVar5 + selectedChannel) * 4);
          goto LAB_001973ba;
        case 0xb:
          fVar6 = HalfToFloat(*(unsigned_short *)((long)image.data + (long)iVar5 * 2));
LAB_001973e2:
          iVar5 = iVar5 + 1;
          break;
        case 0xc:
          fVar6 = HalfToFloat(*(unsigned_short *)
                               ((long)image.data + (long)(iVar5 + selectedChannel) * 2));
LAB_001973f2:
          iVar5 = iVar5 + 3;
          break;
        case 0xd:
          fVar6 = HalfToFloat(*(unsigned_short *)
                               ((long)image.data + (long)(iVar5 + selectedChannel) * 2));
LAB_001973ba:
          iVar5 = iVar5 + 4;
          break;
        default:
switchD_00197251_default:
          fVar6 = -1.0;
        }
        *(char *)((long)pvVar2 + uVar4) = (char)(int)(fVar6 * 255.0);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  else {
    TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
  }
  __return_storage_ptr__->data = pvVar2;
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromChannel(Image image, int selectedChannel)
{
    Image result = { 0 };

    // Security check to avoid program crash
    if ((image.data == NULL) || (image.width == 0) || (image.height == 0)) return result;

    // Check selected channel is valid
    if (selectedChannel < 0)
    {
        TRACELOG(LOG_WARNING, "Channel cannot be negative. Setting channel to 0.");
        selectedChannel = 0;
    }

    if (image.format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE ||
        image.format == PIXELFORMAT_UNCOMPRESSED_R32 ||
        image.format == PIXELFORMAT_UNCOMPRESSED_R16)
    {
        if (selectedChannel > 0)
        {
            TRACELOG(LOG_WARNING, "This image has only 1 channel. Setting channel to it.");
            selectedChannel = 0;
        }
    }
    else if (image.format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
    {
        if (selectedChannel > 1)
        {
            TRACELOG(LOG_WARNING, "This image has only 2 channels. Setting channel to alpha.");
            selectedChannel = 1;
        }
    }
    else if (image.format == PIXELFORMAT_UNCOMPRESSED_R5G6B5 ||
             image.format == PIXELFORMAT_UNCOMPRESSED_R8G8B8 ||
             image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32 ||
             image.format == PIXELFORMAT_UNCOMPRESSED_R16G16B16)
    {
        if (selectedChannel > 2)
        {
            TRACELOG(LOG_WARNING, "This image has only 3 channels. Setting channel to red.");
            selectedChannel = 0;
        }
    }

    // Check for RGBA formats
    if (selectedChannel > 3)
    {
        TRACELOG(LOG_WARNING, "ImageFromChannel supports channels 0 to 3 (rgba). Setting channel to alpha.");
        selectedChannel = 3;
    }

    // TODO: Consider other one-channel formats: R16, R32
    result.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
    result.height = image.height;
    result.width = image.width;
    result.mipmaps = 1;

    unsigned char *pixels = (unsigned char *)RL_CALLOC(image.width*image.height, sizeof(unsigned char)); // Values from 0 to 255

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            float pixelValue = -1;
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixelValue = (float)((unsigned char *)image.data)[i + selectedChannel]/255.0f;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixelValue = (float)((unsigned char *)image.data)[k + selectedChannel]/255.0f;
                    k += 2;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    if (selectedChannel == 0) pixelValue = (float)((pixel & 0b1111100000000000) >> 11)*(1.0f/31);
                    else if (selectedChannel == 1) pixelValue = (float)((pixel & 0b0000011111000000) >> 6)*(1.0f/31);
                    else if (selectedChannel == 2) pixelValue = (float)((pixel & 0b0000000000111110) >> 1)*(1.0f/31);
                    else if (selectedChannel == 3) pixelValue = ((pixel & 0b0000000000000001) == 0)? 0.0f : 1.0f;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    if (selectedChannel == 0) pixelValue = (float)((pixel & 0b1111100000000000) >> 11)*(1.0f/31);
                    else if (selectedChannel == 1) pixelValue = (float)((pixel & 0b0000011111100000) >> 5)*(1.0f/63);
                    else if (selectedChannel == 2) pixelValue = (float)(pixel & 0b0000000000011111)*(1.0f/31);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    if (selectedChannel == 0) pixelValue = (float)((pixel & 0b1111000000000000) >> 12)*(1.0f/15);
                    else if (selectedChannel == 1) pixelValue = (float)((pixel & 0b0000111100000000) >> 8)*(1.0f/15);
                    else if (selectedChannel == 2) pixelValue = (float)((pixel & 0b0000000011110000) >> 4)*(1.0f/15);
                    else if (selectedChannel == 3) pixelValue = (float)(pixel & 0b0000000000001111)*(1.0f/15);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixelValue = (float)((unsigned char *)image.data)[k + selectedChannel]/255.0f;
                    k += 4;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixelValue = (float)((unsigned char *)image.data)[k + selectedChannel]/255.0f;
                    k += 3;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixelValue = ((float *)image.data)[k];
                    k += 1;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixelValue = ((float *)image.data)[k + selectedChannel];
                    k += 3;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixelValue = ((float *)image.data)[k + selectedChannel];
                    k += 4;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16:
                {
                    pixelValue = HalfToFloat(((unsigned short *)image.data)[k]);
                    k += 1;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16:
                {
                    pixelValue = HalfToFloat(((unsigned short *)image.data)[k+selectedChannel]);
                    k += 3;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
                {
                    pixelValue = HalfToFloat(((unsigned short *)image.data)[k + selectedChannel]);
                    k += 4;

                } break;
                default: break;
            }

            pixels[i] = (unsigned char)(pixelValue*255);
        }
    }

    result.data = pixels;

    return result;
}